

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItemGraphVisitor.cxx
# Opt level: O0

void cmLinkItemGraphVisitor::GetDependencies
               (cmGeneratorTarget *target,string *config,DependencyMap *dependencies)

{
  cmGeneratorTarget *t;
  bool bVar1;
  cmLinkImplementationLibraries *this;
  cmLinkInterfaceLibraries *this_00;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *this_01;
  mapped_type *pmVar2;
  DependencyType local_324;
  pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem> local_320;
  _Self local_2d8;
  iterator local_2d0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>
  local_2c8;
  string *local_2c0;
  string *name_3;
  cmLinkItem *item;
  iterator __end1_1;
  iterator __begin1_1;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *__range1_1;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *utilityItems;
  pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem> local_288;
  undefined1 local_240 [24];
  cmLinkItem objectItem;
  iterator local_1e8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>
  local_1e0;
  string *local_1d8;
  string *name_2;
  cmGeneratorTarget **lib_2;
  iterator __end1;
  iterator __begin1;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__range1;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> objectLibraries;
  pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem> local_190;
  DependencyType local_144;
  pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem> local_140;
  _Self local_f8;
  iterator local_f0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>
  local_e8;
  string *local_e0;
  string *name_1;
  cmLinkItem *lib_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *__range2_1;
  cmLinkInterfaceLibraries *interfaceLibraries;
  DependencyType local_9c;
  pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem> local_98;
  key_type *local_50;
  string *name;
  cmLinkImplItem *lib;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *__range2;
  cmLinkImplementationLibraries *implementationLibraries;
  DependencyMap *dependencies_local;
  string *config_local;
  cmGeneratorTarget *target_local;
  
  this = cmGeneratorTarget::GetLinkImplementationLibraries(target,config,Link);
  if (this != (cmLinkImplementationLibraries *)0x0) {
    __end2 = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin(&this->Libraries);
    lib = (cmLinkImplItem *)
          std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end(&this->Libraries);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                                       *)&lib), bVar1) {
      name = (string *)
             __gnu_cxx::
             __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
             ::operator*(&__end2);
      local_50 = cmLinkItem::AsStr_abi_cxx11_((cmLinkItem *)name);
      local_9c = LinkPrivate;
      std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>::
      pair<cmLinkItemGraphVisitor::DependencyType,_const_cmLinkImplItem_&,_true>
                (&local_98,&local_9c,(cmLinkImplItem *)name);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
               ::operator[](dependencies,local_50);
      std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>::operator=(pmVar2,&local_98);
      std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>::~pair(&local_98);
      __gnu_cxx::
      __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
      ::operator++(&__end2);
    }
  }
  this_00 = cmGeneratorTarget::GetLinkInterfaceLibraries(target,config,target,Usage);
  if (this_00 != (cmLinkInterfaceLibraries *)0x0) {
    __end2_1 = std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin(&this_00->Libraries);
    lib_1 = (cmLinkItem *)
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end(&this_00->Libraries);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                               *)&lib_1), bVar1) {
      name_1 = &__gnu_cxx::
                __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                ::operator*(&__end2_1)->String;
      local_e0 = cmLinkItem::AsStr_abi_cxx11_((cmLinkItem *)name_1);
      local_f0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
           ::find(dependencies,local_e0);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>
      ::_Rb_tree_const_iterator(&local_e8,&local_f0);
      local_f8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
           ::cend(dependencies);
      bVar1 = std::operator!=(&local_e8,&local_f8);
      if (bVar1) {
        local_144 = LinkPublic;
        std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>::
        pair<cmLinkItemGraphVisitor::DependencyType,_true>
                  (&local_140,&local_144,(cmLinkItem *)name_1);
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
                 ::operator[](dependencies,local_e0);
        std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>::operator=(pmVar2,&local_140);
        std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>::~pair(&local_140);
      }
      else {
        objectLibraries.
        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>::
        pair<cmLinkItemGraphVisitor::DependencyType,_true>
                  (&local_190,
                   (DependencyType *)
                   ((long)&objectLibraries.
                           super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                   (cmLinkItem *)name_1);
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
                 ::operator[](dependencies,local_e0);
        std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>::operator=(pmVar2,&local_190);
        std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>::~pair(&local_190);
      }
      __gnu_cxx::
      __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>::
      operator++(&__end2_1);
    }
  }
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
            ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&__range1);
  cmGeneratorTarget::GetObjectLibrariesCMP0026
            (target,(vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&__range1);
  __end1 = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                     ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&__range1
                     );
  lib_2 = (cmGeneratorTarget **)
          std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                    ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&__range1)
  ;
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                                     *)&lib_2), bVar1) {
    name_2 = (string *)
             __gnu_cxx::
             __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
             ::operator*(&__end1);
    local_1d8 = cmGeneratorTarget::GetName_abi_cxx11_(*(cmGeneratorTarget **)name_2);
    local_1e8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
         ::find(dependencies,local_1d8);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>
    ::_Rb_tree_const_iterator(&local_1e0,&local_1e8);
    objectItem.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
         ::cend(dependencies);
    bVar1 = std::operator==(&local_1e0,
                            (_Self *)&objectItem.Backtrace.
                                      super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                      TopEntry.
                                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
    if (bVar1) {
      t = *(cmGeneratorTarget **)name_2;
      cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_240);
      cmLinkItem::cmLinkItem
                ((cmLinkItem *)(local_240 + 0x10),t,false,(cmListFileBacktrace *)local_240);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_240);
      utilityItems._4_4_ = 3;
      std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>::
      pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem_&,_true>
                (&local_288,(DependencyType *)((long)&utilityItems + 4),
                 (cmLinkItem *)(local_240 + 0x10));
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
               ::operator[](dependencies,local_1d8);
      std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>::operator=(pmVar2,&local_288);
      std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>::~pair(&local_288);
      cmLinkItem::~cmLinkItem((cmLinkItem *)(local_240 + 0x10));
    }
    __gnu_cxx::
    __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
    ::operator++(&__end1);
  }
  this_01 = cmGeneratorTarget::GetUtilityItems(target);
  __end1_1 = std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::begin
                       (this_01);
  item = (cmLinkItem *)
         std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::end(this_01);
  while (bVar1 = std::operator!=(&__end1_1,(_Self *)&item), bVar1) {
    name_3 = &std::_Rb_tree_const_iterator<cmLinkItem>::operator*(&__end1_1)->String;
    local_2c0 = cmLinkItem::AsStr_abi_cxx11_((cmLinkItem *)name_3);
    local_2d0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
         ::find(dependencies,local_2c0);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>
    ::_Rb_tree_const_iterator(&local_2c8,&local_2d0);
    local_2d8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
         ::cend(dependencies);
    bVar1 = std::operator==(&local_2c8,&local_2d8);
    if (bVar1) {
      local_324 = Utility;
      std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>::
      pair<cmLinkItemGraphVisitor::DependencyType,_true>(&local_320,&local_324,(cmLinkItem *)name_3)
      ;
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
               ::operator[](dependencies,local_2c0);
      std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>::operator=(pmVar2,&local_320);
      std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>::~pair(&local_320);
    }
    std::_Rb_tree_const_iterator<cmLinkItem>::operator++(&__end1_1);
  }
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~vector
            ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&__range1);
  return;
}

Assistant:

void cmLinkItemGraphVisitor::GetDependencies(cmGeneratorTarget const& target,
                                             std::string const& config,
                                             DependencyMap& dependencies)
{
  const auto* implementationLibraries = target.GetLinkImplementationLibraries(
    config, cmGeneratorTarget::LinkInterfaceFor::Link);
  if (implementationLibraries != nullptr) {
    for (auto const& lib : implementationLibraries->Libraries) {
      auto const& name = lib.AsStr();
      dependencies[name] = Dependency(DependencyType::LinkPrivate, lib);
    }
  }

  const auto* interfaceLibraries = target.GetLinkInterfaceLibraries(
    config, &target, cmGeneratorTarget::LinkInterfaceFor::Usage);
  if (interfaceLibraries != nullptr) {
    for (auto const& lib : interfaceLibraries->Libraries) {
      auto const& name = lib.AsStr();
      if (dependencies.find(name) != dependencies.cend()) {
        dependencies[name] = Dependency(DependencyType::LinkPublic, lib);
      } else {
        dependencies[name] = Dependency(DependencyType::LinkInterface, lib);
      }
    }
  }

  std::vector<cmGeneratorTarget*> objectLibraries;
  target.GetObjectLibrariesCMP0026(objectLibraries);
  for (auto const& lib : objectLibraries) {
    auto const& name = lib->GetName();
    if (dependencies.find(name) == dependencies.cend()) {
      auto objectItem = cmLinkItem(lib, false, lib->GetBacktrace());
      dependencies[name] = Dependency(DependencyType::Object, objectItem);
    }
  }

  auto const& utilityItems = target.GetUtilityItems();
  for (auto const& item : utilityItems) {
    auto const& name = item.AsStr();
    if (dependencies.find(name) == dependencies.cend()) {
      dependencies[name] = Dependency(DependencyType::Utility, item);
    }
  }
}